

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

bool __thiscall
kwssys::RegularExpression::operator==(RegularExpression *this,RegularExpression *rxp)

{
  int iVar1;
  int ind;
  RegularExpression *rxp_local;
  RegularExpression *this_local;
  bool local_1;
  
  if (this == rxp) {
LAB_001c5f5f:
    local_1 = true;
  }
  else {
    ind = this->progsize;
    if (this->progsize == rxp->progsize) {
      do {
        iVar1 = ind + -1;
        if (ind == 0) goto LAB_001c5f5f;
        ind = iVar1;
      } while (this->program[iVar1] == rxp->program[iVar1]);
      local_1 = false;
    }
    else {
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool RegularExpression::operator==(const RegularExpression& rxp) const
{
  if (this != &rxp) {         // Same address?
    int ind = this->progsize; // Get regular expression size
    if (ind != rxp.progsize)  // If different size regexp
      return false;           // Return failure
    while (ind-- != 0)        // Else while still characters
      if (this->program[ind] != rxp.program[ind]) // If regexp are different
        return false;                             // Return failure
  }
  return true; // Else same, return success
}